

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

ON_XMLVariant * __thiscall
ON_InternalXMLImpl::InternalGetParameter
          (ON_XMLVariant *__return_storage_ptr__,ON_InternalXMLImpl *this,wchar_t *path_to_node,
          wchar_t *param_name,wchar_t *default_type,ON_XMLVariant *def)

{
  bool bVar1;
  int iVar2;
  ON_XMLNode *pOVar3;
  undefined4 extraout_var;
  undefined1 local_160 [8];
  ON_XMLParameters p;
  ON_XMLVariant value;
  ON_XMLNode *node_read;
  lock_guard<std::recursive_mutex> lg;
  ON_XMLVariant *def_local;
  wchar_t *default_type_local;
  wchar_t *param_name_local;
  wchar_t *path_to_node_local;
  ON_InternalXMLImpl *this_local;
  
  lg._M_device = (mutex_type *)def;
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)&node_read,&this->_mutex);
  pOVar3 = Node(this);
  iVar2 = (*pOVar3->_vptr_ON_XMLNode[0x29])(pOVar3,path_to_node);
  if ((ON_XMLNode *)CONCAT44(extraout_var,iVar2) == (ON_XMLNode *)0x0) {
    ::ON_XMLVariant::ON_XMLVariant(__return_storage_ptr__,(ON_XMLVariant *)lg._M_device);
  }
  else {
    ::ON_XMLVariant::ON_XMLVariant((ON_XMLVariant *)&p._private);
    ON_XMLParameters::ON_XMLParameters
              ((ON_XMLParameters *)local_160,(ON_XMLNode *)CONCAT44(extraout_var,iVar2));
    ON_XMLParameters::SetDefaultReadType((ON_XMLParameters *)local_160,default_type);
    bVar1 = ON_XMLParameters::GetParam
                      ((ON_XMLParameters *)local_160,param_name,(ON_XMLVariant *)&p._private);
    if (bVar1) {
      ::ON_XMLVariant::ON_XMLVariant(__return_storage_ptr__,(ON_XMLVariant *)&p._private);
    }
    else {
      ::ON_XMLVariant::ON_XMLVariant(__return_storage_ptr__,(ON_XMLVariant *)lg._M_device);
    }
    ON_XMLParameters::~ON_XMLParameters((ON_XMLParameters *)local_160);
    ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&p._private);
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)&node_read)
  ;
  return __return_storage_ptr__;
}

Assistant:

ON_XMLVariant ON_InternalXMLImpl::InternalGetParameter(const wchar_t* path_to_node, const wchar_t* param_name, const wchar_t* default_type, const ON_XMLVariant& def) const
{
  std::lock_guard<std::recursive_mutex> lg(_mutex);

  const ON_XMLNode* node_read = Node().GetNodeAtPath(path_to_node);
  if (nullptr == node_read)
    return def;

  ON_XMLVariant value;
  ON_XMLParameters p(*node_read);
  p.SetDefaultReadType(default_type);
  if (!p.GetParam(param_name, value))
    return def;

  return value;
}